

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-cpuid.c
# Opt level: O3

int cpuid_is_vendor_intel(void)

{
  long lVar1;
  undefined3 uStack_13;
  
  lVar1 = cpuid_basic_info(0);
  uStack_13 = (undefined3)((uint)*(undefined4 *)(lVar1 + 8) >> 8);
  return (uint)(CONCAT43(*(undefined4 *)(lVar1 + 0xc),uStack_13) == 0x6c65746e49656e &&
               *(long *)(lVar1 + 4) == 0x49656e69756e6547);
}

Assistant:

int cpuid_is_vendor_intel(void) {
  asm_cpuid_data cpudata;
  union {
    char c[16];
    uint32_t i[16 / sizeof(uint32_t)];
  } vendor_id;
  memset(&vendor_id.c, 0, sizeof(vendor_id));
  asm_cpuid(0, &cpudata);
  vendor_id.i[0] = cpudata.ebx;
  vendor_id.i[1] = cpudata.edx;
  vendor_id.i[2] = cpudata.ecx;
  raplcap_log(DEBUG, "cpuid_is_vendor_intel: vendor_id=%s\n", vendor_id.c);
  return !strncmp(vendor_id.c, CPUID_VENDOR_ID_GENUINE_INTEL, sizeof(CPUID_VENDOR_ID_GENUINE_INTEL));
}